

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consist.c
# Opt level: O0

void consistency(void)

{
  uint uVar1;
  Item *pIVar2;
  Item *pIVar3;
  bool bVar4;
  Symbol *s1_00;
  Symbol *s1;
  long t;
  int err;
  int tu;
  int i;
  Item *qs;
  Symbol *s;
  char *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  int local_14;
  Item *local_10;
  
  bVar4 = false;
  if ((scop_indep != indepsym) && (scop_indep->subtype == 6)) {
    scop_indep->subtype = 4;
  }
  for (local_14 = 0x41; local_14 < 0x7b; local_14 = local_14 + 1) {
    for (local_10 = symlist[local_14]->next; local_10 != symlist[local_14];
        local_10 = local_10->next) {
      pIVar2 = (local_10->element).itm;
      if (pIVar2->itemtype == 0x13e) {
        pIVar3 = (pIVar2->element).itm;
        if ((((ulong)pIVar3 & 1) != 0) && (((ulong)pIVar3 & 0xfffffffffffffffe) != 0)) {
          fprintf(_stderr,"%s is a %s\n",pIVar2[2].element.itm,"KEYWORD");
          bVar4 = true;
        }
        if ((((ulong)pIVar3 & 0xd48000) != 0) && (((ulong)pIVar3 & 0xffffffffff2b7fff) != 0)) {
          fprintf(_stderr,"%s is a %s\n",pIVar2[2].element.itm,"RESERVED WORD");
          bVar4 = true;
        }
        if ((((ulong)pIVar3 & 0x80000) != 0) && (((ulong)pIVar3 & 0xfffffffffff7ffff) != 0)) {
          fprintf(_stderr,"%s is a %s\n",pIVar2[2].element.itm,"CONSTANT");
          bVar4 = true;
        }
        if ((((ulong)pIVar3 & 2) != 0) && (((ulong)pIVar3 & 0xffffffffffffffdd) != 0)) {
          fprintf(_stderr,"%s is a %s\n",pIVar2[2].element.itm,"PARAMETER");
          bVar4 = true;
        }
        if ((((ulong)pIVar3 & 8) != 0) && (((ulong)pIVar3 & 0xffffffffffffffd7) != 0)) {
          fprintf(_stderr,"%s is a %s\n",pIVar2[2].element.itm,"ASSIGNED");
          bVar4 = true;
        }
        if ((((ulong)pIVar3 & 4) != 0) && (((ulong)pIVar3 & 0xfffffffffffffffb) != 0)) {
          fprintf(_stderr,"%s is a %s\n",pIVar2[2].element.itm,"INDEPENDENT");
          bVar4 = true;
        }
        if ((((ulong)pIVar3 & 0x10) != 0) && (((ulong)pIVar3 & 0xffffffffffffffcf) != 0)) {
          fprintf(_stderr,"%s is a %s\n",pIVar2[2].element.itm,"STATE");
          bVar4 = true;
        }
        if ((((ulong)pIVar3 & 0x40) != 0) && (((ulong)pIVar3 & 0xffffffffffffffbf) != 0)) {
          fprintf(_stderr,"%s is a %s\n",pIVar2[2].element.itm,"FUNCTION");
          bVar4 = true;
        }
        if ((((ulong)pIVar3 & 0x80) != 0) && (((ulong)pIVar3 & 0xffffffffffffff7f) != 0)) {
          fprintf(_stderr,"%s is a %s\n",pIVar2[2].element.itm,"PROCEDURE");
          bVar4 = true;
        }
        if ((((ulong)pIVar3 & 0x200) != 0) && (((ulong)pIVar3 & 0xfffffffffffffdff) != 0)) {
          fprintf(_stderr,"%s is a %s\n",pIVar2[2].element.itm,"DERIVATIVE");
          bVar4 = true;
        }
        if ((((ulong)pIVar3 & 0x400) != 0) && (((ulong)pIVar3 & 0xfffffffffffffbff) != 0)) {
          fprintf(_stderr,"%s is a %s\n",pIVar2[2].element.itm," KINETIC");
          bVar4 = true;
        }
        if ((((ulong)pIVar3 & 0x10000) != 0) && (((ulong)pIVar3 & 0xfffffffffffeffff) != 0)) {
          fprintf(_stderr,"%s is a %s\n",pIVar2[2].element.itm,"LINEAR");
          bVar4 = true;
        }
        if ((((ulong)pIVar3 & 0x800) != 0) && (((ulong)pIVar3 & 0xfffffffffffff7ff) != 0)) {
          fprintf(_stderr,"%s is a %s\n",pIVar2[2].element.itm,"NONLINEAR");
          bVar4 = true;
        }
        if ((((ulong)pIVar3 & 0x1000) != 0) && (((ulong)pIVar3 & 0xffffffffffffefff) != 0)) {
          fprintf(_stderr,"%s is a %s\n",pIVar2[2].element.itm,"DISCRETE");
          bVar4 = true;
        }
        if ((((ulong)pIVar3 & 0x4000) != 0) && (((ulong)pIVar3 & 0xffffffffffffbfff) != 0)) {
          fprintf(_stderr,"%s is a %s\n",pIVar2[2].element.itm,"PARTIAL");
          bVar4 = true;
        }
        if ((((ulong)pIVar3 & 0x2000) != 0) && (((ulong)pIVar3 & 0xffffffffffffdfff) != 0)) {
          fprintf(_stderr,"%s is a %s\n",pIVar2[2].element.itm,"STEPPED");
          bVar4 = true;
        }
        if ((((ulong)pIVar3 & 0x20000) != 0) && (((ulong)pIVar3 & 0xfffffffffffdffff) != 0)) {
          fprintf(_stderr,"%s is a %s\n",pIVar2[2].element.itm,"CONSTANT UNITS FACTOR");
          bVar4 = true;
        }
        uVar1 = *(uint *)((long)&pIVar2[1].next + 4);
        if (((uVar1 & 8) != 0) && ((uVar1 & 0x40) != 0)) {
          diag(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        }
        if ((pIVar3 == (Item *)0x0) && (uVar1 != 0)) {
          fprintf(_stderr,"Warning: %s undefined. (declared within VERBATIM?)\n",
                  pIVar2[2].element.itm);
        }
      }
    }
  }
  if (bVar4) {
    diag(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  if (indepsym == (Symbol *)0x0) {
    diag(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  for (local_14 = 0x41; local_14 < 0x7b; local_14 = local_14 + 1) {
    for (local_10 = symlist[local_14]->next; local_10 != symlist[local_14];
        local_10 = local_10->next) {
      pIVar2 = (local_10->element).itm;
      if ((((pIVar2->itemtype == 0x13e) && (((ulong)(pIVar2->element).itm & 0x10) != 0)) &&
          (*pIVar2[2].element.str == 'D')) &&
         (((s1_00 = lookup(in_stack_ffffffffffffffc8), s1_00 != (Symbol *)0x0 &&
           (pIVar2->itemtype == 0x13e)) && (((ulong)(pIVar2->element).itm & 0x10) != 0)))) {
        fprintf(_stderr,"%s is a STATE so %s is a %s\' and",s1_00->name,pIVar2[2].element.itm,
                s1_00->name);
        diag((char *)s1_00,in_stack_ffffffffffffffc8);
      }
    }
  }
  return;
}

Assistant:

void consistency()
{
	Symbol         *s;
	Item           *qs;
	int             i, tu, err = 0;
	long            t;


	/* the scop_indep can also be a automatic parameter */
	if (scop_indep != indepsym && scop_indep->subtype == (PARM | INDEP)) {
		scop_indep->subtype = INDEP;
	}
	
	SYMITER(NAME) {
		t = s->subtype;
		con("KEYWORD", KEYWORD, 0);
		con("RESERVED WORD", EXTDEF|EXTDEF2|EXTDEF3|EXTDEF4|EXTDEF5, 0);
		con("CONSTANT", nmodlCONST, 0);
		con("PARAMETER", PARM, ARRAY);
		con("ASSIGNED", DEP, ARRAY);
		con("INDEPENDENT", INDEP, 0);
		con("STATE", STAT, ARRAY);
		con("FUNCTION", FUNCT, 0);
		con("PROCEDURE", PROCED, 0);
		con("DERIVATIVE", DERF, 0);
		con(" KINETIC", KINF, 0);
		con("LINEAR", LINF, 0);
		con("NONLINEAR", NLINF, 0);
		con("DISCRETE", DISCF, 0);
		con("PARTIAL", PARF, 0);
		con("STEPPED", STEP1, 0);
		con("CONSTANT UNITS FACTOR", UNITDEF, 0);
		tu = s->usage;
		if ((tu & DEP) && (tu & FUNCT))
			diag(s->name, " used as both variable and function");
		if ((t == 0) && tu)
			Fprintf(stderr,
				"Warning: %s undefined. (declared within VERBATIM?)\n", s->name);
	}
	if (err) {
		diag("multiple uses for same variable", (char *) 0);
	}
	if (indepsym == SYM0) {
		diag("Independent variable is not defined", (char *)0);
	}
	/* avoid the problem where person inadvertently is using Dstate as a state*/
	SYMITER(NAME) {
		if ((s->subtype & STAT) && (s->name[0] == 'D')) {
			Symbol* s1 = lookup(s->name + 1);
			if (s1 && s->type == NAME && (s->subtype & STAT)) {
fprintf(stderr, "%s is a STATE so %s is a %s' and", s1->name, s->name, s1->name);
diag(" cannot be declared as a STATE\n", (char*)0);
			}
		}
	}
}